

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

TextureData __thiscall QRhiWidgetPrivate::texture(QRhiWidgetPrivate *this)

{
  TextureData TVar1;
  long in_RDI;
  long in_FS_OFFSET;
  TextureData td;
  QList<QRhiResource_*> *in_stack_ffffffffffffffc0;
  QRhiTexture *local_30;
  TextureData local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qDeleteAll<QList<QRhiResource*>>(in_stack_ffffffffffffffc0);
  QList<QRhiResource_*>::clear(in_stack_ffffffffffffffc0);
  local_18.textureLeft = (QRhiTexture *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.textureRight = (QRhiTexture *)&DAT_aaaaaaaaaaaaaaaa;
  QWidgetPrivate::TextureData::TextureData(&local_18);
  if ((*(byte *)(in_RDI + 0x2c0) & 1) == 0) {
    if (*(long *)(in_RDI + 0x2d8) == 0) {
      local_30 = *(QRhiTexture **)(in_RDI + 0x2c8);
    }
    else {
      local_30 = *(QRhiTexture **)(in_RDI + 0x2d8);
    }
    local_18.textureLeft = local_30;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    TVar1.textureRight = local_18.textureRight;
    TVar1.textureLeft = local_18.textureLeft;
    return TVar1;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetPrivate::TextureData QRhiWidgetPrivate::texture() const
{
    // This is the only safe place to clear pendingDeletes, due to the
    // possibility of the texture returned in the previous invocation of this
    // function having been added to pendingDeletes, meaning the object then
    // needs to be valid until the next (this) invocation of this function.
    // (the exact object lifetime requirements depend on the
    // QWidget/RepaintManager internal implementation; for now avoid relying on
    // such details by clearing pendingDeletes only here, not in endCompose())
    qDeleteAll(pendingDeletes);
    pendingDeletes.clear();

    TextureData td;
    if (!textureInvalid)
        td.textureLeft = resolveTexture ? resolveTexture : colorTexture;
    return td;
}